

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O3

int x25519_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  CBS inner;
  CBS local_20;
  
  if (((params->len == 0) && (iVar1 = CBS_get_asn1(key,&local_20,4), iVar1 != 0)) && (key->len == 0)
     ) {
    iVar1 = x25519_set_priv_raw(out,local_20.data,local_20.len);
    return iVar1;
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                ,0xb0);
  return 0;
}

Assistant:

static int x25519_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 8410, section 7.

  // Parameters must be empty. The key is a 32-byte value wrapped in an extra
  // OCTET STRING layer.
  CBS inner;
  if (CBS_len(params) != 0 ||
      !CBS_get_asn1(key, &inner, CBS_ASN1_OCTETSTRING) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  return x25519_set_priv_raw(out, CBS_data(&inner), CBS_len(&inner));
}